

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# rtree.h
# Opt level: O3

rtree_metadata_t
rtree_metadata_read(tsdn_t *tsdn,rtree_t *rtree,rtree_ctx_t *rtree_ctx,uintptr_t key)

{
  undefined8 *puVar1;
  undefined8 *puVar2;
  undefined8 *puVar3;
  void *pvVar4;
  undefined8 uVar5;
  rtree_leaf_elm_t *prVar6;
  void *pvVar7;
  void *pvVar8;
  ulong uVar9;
  long lVar10;
  rtree_metadata_t rVar11;
  
  pvVar7 = (void *)((ulong)rtree_ctx & 0xffffffffc0000000);
  uVar9 = (ulong)(((uint)((ulong)rtree_ctx >> 0x1e) & 0xf) << 4);
  puVar1 = (undefined8 *)((long)&((rtree_t *)(rtree->root + -0xf))->base + uVar9);
  pvVar4 = *(void **)((long)&((rtree_t *)(rtree->root + -0xf))->base + uVar9);
  if (pvVar4 == pvVar7) {
    prVar6 = (rtree_leaf_elm_t *)((ulong)((uint)rtree_ctx >> 9 & 0x1ffff8) + puVar1[1]);
  }
  else if (rtree->root[0x11].child.repr == pvVar7) {
    pvVar8 = rtree->root[0x12].child.repr;
    rtree->root[0x11].child.repr = pvVar4;
    rtree->root[0x12].child.repr = (void *)puVar1[1];
LAB_01d51dec:
    *puVar1 = pvVar7;
    puVar1[1] = pvVar8;
    prVar6 = (rtree_leaf_elm_t *)((ulong)((uint)rtree_ctx >> 9 & 0x1ffff8) + (long)pvVar8);
  }
  else {
    lVar10 = 0x118;
    do {
      if (*(void **)((long)(rtree->root + -0x10) + lVar10) == pvVar7) {
        pvVar8 = *(void **)((long)&((rtree_t *)(rtree->root + -0xf))->base + lVar10);
        puVar2 = (undefined8 *)((long)rtree + lVar10 + -0x18);
        uVar5 = puVar2[1];
        puVar3 = (undefined8 *)((long)(rtree->root + -0x10) + lVar10);
        *puVar3 = *puVar2;
        puVar3[1] = uVar5;
        *(void **)((long)rtree + lVar10 + -0x18) = pvVar4;
        *(undefined8 *)((long)rtree + lVar10 + -0x10) = puVar1[1];
        goto LAB_01d51dec;
      }
      lVar10 = lVar10 + 0x10;
    } while (lVar10 != 0x188);
    prVar6 = duckdb_je_rtree_leaf_elm_lookup_hard
                       (tsdn,&duckdb_je_arena_emap_global.rtree,(rtree_ctx_t *)rtree,
                        (uintptr_t)rtree_ctx,true,false);
  }
  pvVar4 = (prVar6->le_bits).repr;
  rVar11._0_8_ = (ulong)((uint)pvVar4 & 0x1c) << 0x1e | (ulong)pvVar4 >> 0x30;
  rVar11._8_4_ = (uint)((byte)(((ulong)pvVar4 & 0xffffffff) >> 1) & 1) | ((uint)pvVar4 & 1) << 8;
  return rVar11;
}

Assistant:

static inline rtree_metadata_t
rtree_metadata_read(tsdn_t *tsdn, rtree_t *rtree, rtree_ctx_t *rtree_ctx,
    uintptr_t key) {
	rtree_leaf_elm_t *elm = rtree_leaf_elm_lookup(tsdn, rtree, rtree_ctx,
	    key, /* dependent */ true, /* init_missing */ false);
	assert(elm != NULL);
	return rtree_leaf_elm_read(tsdn, rtree, elm,
	    /* dependent */ true).metadata;
}